

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_manager.cpp
# Opt level: O2

void __thiscall
duckdb::BufferManager::WriteTemporaryBuffer
          (BufferManager *this,MemoryTag tag,block_id_t block_id,FileBuffer *buffer)

{
  NotImplementedException *this_00;
  undefined7 in_register_00000031;
  allocator local_39;
  string local_38;
  
  this_00 = (NotImplementedException *)
            __cxa_allocate_exception(0x10,CONCAT71(in_register_00000031,tag));
  ::std::__cxx11::string::string
            ((string *)&local_38,
             "This type of BufferManager does not support \'WriteTemporaryBuffer",&local_39);
  NotImplementedException::NotImplementedException(this_00,&local_38);
  __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void BufferManager::WriteTemporaryBuffer(MemoryTag tag, block_id_t block_id, FileBuffer &buffer) {
	throw NotImplementedException("This type of BufferManager does not support 'WriteTemporaryBuffer");
}